

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Rpm(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *pGVar5;
  char *pcVar6;
  uint fVeryVerbose;
  uint fVerbose;
  char *pcVar7;
  uint local_44;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  local_44 = 0x10;
  bVar2 = false;
  fVerbose = 0;
  fVeryVerbose = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while (iVar4 = Extra_UtilGetopt(argc,argv,"Cnavwh"), iVar3 = globalUtilOptind,
                iVar4 == 0x77) {
            fVeryVerbose = fVeryVerbose ^ 1;
          }
          if (iVar4 == -1) {
            pGVar5 = pAbc->pGia;
            if (pGVar5 != (Gia_Man_t *)0x0) {
              if (bVar1) {
                pGVar5 = Gia_ManDupReplaceCut(pGVar5);
              }
              else if (bVar2) {
                pGVar5 = Abs_RpmPerformOld(pGVar5,fVerbose);
              }
              else {
                pGVar5 = Abs_RpmPerform(pGVar5,local_44,fVerbose,fVeryVerbose);
              }
              Abc_FrameUpdateGia(pAbc,pGVar5);
              return 0;
            }
            Abc_Print(-1,"Abc_CommandAbc9Rpm(): There is no AIG.\n");
            return 0;
          }
          if (iVar4 != 0x76) break;
          fVerbose = fVerbose ^ 1;
        }
        if (iVar4 != 0x61) break;
        bVar2 = (bool)(bVar2 ^ 1);
      }
      if (iVar4 != 0x6e) break;
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar4 != 0x43) goto LAB_00255dcf;
    if (argc <= globalUtilOptind) break;
    local_44 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)local_44 < 0) {
LAB_00255dcf:
      Abc_Print(-2,"usage: &rpm [-C num] [-navwh]\n");
      Abc_Print(-2,"\t         performs structural reparametrization\n");
      Abc_Print(-2,"\t-C num : max cut size for testing range equivalence [default = %d]\n",
                (ulong)local_44);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-n     : toggle using naive reparametrization [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (!bVar2) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle using old algorithm [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (fVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      if (fVeryVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing more verbose information [default = %s]\n",pcVar7);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
  goto LAB_00255dcf;
}

Assistant:

int Abc_CommandAbc9Rpm( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManDupReplaceCut( Gia_Man_t * p );
    Gia_Man_t * pTemp;
    int c, nCutMax   = 16;
    int fUseNaive    =  0;
    int fUseOldAlgo  =  0;
    int fVerbose     =  0;
    int fVeryVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Cnavwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutMax < 0 )
                goto usage;
            break;
        case 'n':
            fUseNaive ^= 1;
            break;
        case 'a':
            fUseOldAlgo ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Rpm(): There is no AIG.\n" );
        return 0;
    }
    if ( fUseNaive )
        pTemp = Gia_ManDupReplaceCut( pAbc->pGia );
    else if ( fUseOldAlgo )
        pTemp = Abs_RpmPerformOld( pAbc->pGia, fVerbose );
    else
        pTemp = Abs_RpmPerform( pAbc->pGia, nCutMax, fVerbose, fVeryVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &rpm [-C num] [-navwh]\n" );
    Abc_Print( -2, "\t         performs structural reparametrization\n" );
    Abc_Print( -2, "\t-C num : max cut size for testing range equivalence [default = %d]\n", nCutMax );
    Abc_Print( -2, "\t-n     : toggle using naive reparametrization [default = %s]\n", fUseNaive? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle using old algorithm [default = %s]\n", fUseOldAlgo? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing more verbose information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}